

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall OpenMesh::PropertyT<short>::swap(PropertyT<short> *this,size_t _i0,size_t _i1)

{
  reference __a;
  reference __b;
  size_t _i1_local;
  size_t _i0_local;
  PropertyT<short> *this_local;
  
  __a = std::vector<short,_std::allocator<short>_>::operator[](&this->data_,_i0);
  __b = std::vector<short,_std::allocator<short>_>::operator[](&this->data_,_i1);
  std::swap<short>(__a,__b);
  return;
}

Assistant:

virtual void swap(size_t _i0, size_t _i1)
  { std::swap(data_[_i0], data_[_i1]); }